

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O3

int MPIABI_File_write_all
              (MPIABI_File fh,void *buf,int count,MPIABI_Datatype datatype,MPIABI_Status *status)

{
  int iVar1;
  MPI_Status *mpi_status_ptr;
  
  iVar1 = MPI_File_write_all();
  if (status != (MPIABI_Status *)0x0) {
    status->MPI_SOURCE = (int)*(undefined8 *)&status->mpi_status;
    status->MPI_TAG = (int)((ulong)*(undefined8 *)&status->mpi_status >> 0x20);
    status->MPI_ERROR = (status->mpi_status).status_OpenMPI.f2;
  }
  return iVar1;
}

Assistant:

int MPIABI_File_write_all(
  MPIABI_File fh,
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  MPIABI_Status * status
) {
  return MPI_File_write_all(
    (MPI_File)(WPI_File)fh,
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Status *)(WPI_StatusPtr)status
  );
}